

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

natwm_error parser_read_key(parser *parser,char **result,size_t *length)

{
  parser_token pVar1;
  undefined8 uVar2;
  size_t local_58;
  size_t stripped_key_length;
  char *stripped_key;
  char *key;
  size_t equal_pos;
  char *line;
  size_t *psStack_28;
  natwm_error err;
  size_t *length_local;
  char **result_local;
  parser *parser_local;
  
  uVar2 = 0x1094f9;
  line._4_4_ = 0x20;
  equal_pos = (size_t)(parser->buffer + parser->pos);
  psStack_28 = length;
  length_local = (size_t *)result;
  result_local = &parser->buffer;
  pVar1 = char_to_token(*(char *)equal_pos);
  if (pVar1 == ALPHA_CHAR) {
    key = (char *)0x0;
    stripped_key = (char *)0x0;
    line._4_4_ = string_get_delimiter((char *)equal_pos,'=',&stripped_key,(size_t *)&key,false);
    if (line._4_4_ == NO_ERROR) {
      stripped_key_length = 0;
      local_58 = 0;
      line._4_4_ = string_strip_surrounding_spaces
                             (stripped_key,(char **)&stripped_key_length,&local_58);
      if (line._4_4_ == NO_ERROR) {
        free(stripped_key);
        parser_move((parser *)result_local,(size_t)key);
        *length_local = stripped_key_length;
        if (psStack_28 != (size_t *)0x0) {
          *psStack_28 = local_58;
        }
        parser_local._4_4_ = NO_ERROR;
      }
      else {
        internal_logger(natwm_logger,LEVEL_ERROR,"Invalid config value - Line %zu",result_local[3]);
        free(stripped_key);
        free((void *)stripped_key_length);
        parser_local._4_4_ = INVALID_INPUT_ERROR;
      }
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Missing \'=\' - Line: %zu",result_local[3]);
      parser_local._4_4_ = INVALID_INPUT_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Invalid Key: \'%c\' - Line: %zu Col: %zu",
                    (ulong)(uint)(int)*(char *)equal_pos,result_local[3],result_local[4],uVar2);
    parser_local._4_4_ = INVALID_INPUT_ERROR;
  }
  return parser_local._4_4_;
}

Assistant:

enum natwm_error parser_read_key(struct parser *parser, char **result, size_t *length)
{
        enum natwm_error err = GENERIC_ERROR;
        const char *line = parser->buffer + parser->pos;

        if (char_to_token(line[0]) != ALPHA_CHAR) {
                LOG_ERROR(natwm_logger,
                          "Invalid Key: '%c' - Line: %zu Col: %zu",
                          line[0],
                          parser->line_num,
                          parser->col_num);

                return INVALID_INPUT_ERROR;
        }

        // Find the EQUAL_CHAR which will allows us to know the bounds of the
        // key
        size_t equal_pos = 0;
        char *key = NULL;

        err = string_get_delimiter(line, '=', &key, &equal_pos, false);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Missing '=' - Line: %zu", parser->line_num);

                return INVALID_INPUT_ERROR;
        }

        // We should now be able to strip the spaces around the key which will
        // leave us with a valid key
        char *stripped_key = NULL;
        size_t stripped_key_length = 0;

        err = string_strip_surrounding_spaces(key, &stripped_key, &stripped_key_length);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid config value - Line %zu", parser->line_num);

                free(key);
                free(stripped_key);

                return INVALID_INPUT_ERROR;
        }

        // Cleanup the intermediate key
        free(key);

        // Update the buffer position to the equal pos
        parser_move(parser, equal_pos);

        // Now we can return our valid key and key length
        *result = stripped_key;

        SET_IF_NON_NULL(length, stripped_key_length);

        return NO_ERROR;
}